

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O3

int raplcap_pd_set_zone_enabled(raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone,int enabled)

{
  long msr;
  int iVar1;
  int iVar2;
  raplcap_msr *ctx;
  int *piVar3;
  uint64_t msrval;
  int local_3c;
  uint64_t local_38;
  
  local_3c = enabled;
  ctx = get_state(rc,pkg,die);
  if (zone < (RAPLCAP_ZONE_PSYS|RAPLCAP_ZONE_CORE)) {
    msr = ZONE_OFFSETS_PL[zone];
    iVar2 = -1;
    if (-1 < msr && ctx != (raplcap_msr *)0x0) {
      iVar1 = msr_sys_read(ctx->sys,&local_38,pkg,0,msr);
      if (iVar1 == 0) {
        local_38 = msr_set_zone_enabled(&ctx->ctx,zone,local_38,&local_3c,&local_3c);
        iVar2 = msr_sys_write(ctx->sys,local_38,pkg,die,msr);
        if (iVar2 == 0) {
          local_38 = msr_set_zone_clamped(&ctx->ctx,zone,local_38,&local_3c,&local_3c);
          msr_sys_write(ctx->sys,local_38,pkg,die,msr);
          iVar2 = 0;
        }
      }
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int raplcap_pd_set_zone_enabled(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone, int enabled) {
  uint64_t msrval;
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_PL);
  int ret;
  raplcap_log(DEBUG, "raplcap_pd_set_zone_enabled: pkg=%"PRIu32", die=%"PRIu32", zone=%d\n", pkg, die, zone);
  if (state == NULL || msr < 0 || msr_sys_read(state->sys, &msrval, pkg, 0, msr)) {
    return -1;
  }
  msrval = msr_set_zone_enabled(&state->ctx, zone, msrval, &enabled, &enabled);
  if ((ret = msr_sys_write(state->sys, msrval, pkg, die, msr)) == 0) {
    // try to clamp (not supported by all zones or all CPUs)
    msrval = msr_set_zone_clamped(&state->ctx, zone, msrval, &enabled, &enabled);
    if (msr_sys_write(state->sys, msrval, pkg, die, msr)) {
      raplcap_log(INFO, "Clamping not available for this zone or platform\n");
    }
  }
  return ret;
}